

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
notch::io::CSVReader::readCSVRow
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,CSVReader *this,string *row)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference pcVar2;
  reference pvVar3;
  string *local_128;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  char local_99;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_98;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  size_t i;
  allocator local_61;
  string *local_60;
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_25;
  uint local_24;
  string *psStack_20;
  CSVReaderState state;
  string *row_local;
  CSVReader *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fields;
  
  local_24 = 0;
  local_25 = 0;
  i._3_1_ = 1;
  local_60 = local_58;
  psStack_20 = row;
  row_local = (string *)this;
  this_local = (CSVReader *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_61);
  i._3_1_ = 0;
  local_38 = (iterator)local_58;
  local_30 = 1;
  core::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&i + 2));
  __l._M_len = local_30;
  __l._M_array = local_38;
  core::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&i + 2));
  core::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&i + 2));
  local_128 = (string *)&local_38;
  do {
    local_128 = local_128 + -0x20;
    std::__cxx11::string::~string(local_128);
  } while (local_128 != local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  __range2 = (string *)0x0;
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_98._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff68), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    local_99 = *pcVar2;
    if (local_24 == 0) {
      if (local_99 == this->delimiter) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"",&local_c1);
        core::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_c0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        __range2 = __range2 + 1;
      }
      else if (local_99 == '\"') {
        local_24 = 1;
      }
      else {
        pvVar3 = core::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](__return_storage_ptr__,(size_type)__range2);
        std::__cxx11::string::push_back((char)pvVar3);
      }
    }
    else if (local_24 == 1) {
      if (local_99 == '\"') {
        local_24 = 2;
      }
      else {
        pvVar3 = core::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](__return_storage_ptr__,(size_type)__range2);
        std::__cxx11::string::push_back((char)pvVar3);
      }
    }
    else if (local_24 == 2) {
      if (local_99 == this->delimiter) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e8,"",&local_e9);
        core::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_e8);
        std::__cxx11::string::~string(local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        __range2 = __range2 + 1;
        local_24 = 0;
      }
      else {
        bVar1 = local_99 == '\"';
        if (bVar1) {
          pvVar3 = core::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](__return_storage_ptr__,(size_type)__range2);
          std::__cxx11::string::push_back((char)pvVar3);
        }
        local_24 = (uint)bVar1;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> readCSVRow(const std::string &row) {
        CSVReaderState state = CSVReaderState::UnquotedField;
        std::vector<std::string> fields {""};
        size_t i = 0; // index of the current field
        for (char c : row) {
            switch (state) {
                case CSVReaderState::UnquotedField:
                    if (c == delimiter) { // end of field
                          fields.push_back(""); i++;
                    } else if (c == '"') {
                        state = CSVReaderState::QuotedField;
                    } else {
                        fields[i].push_back(c);
                    }
                    break;
                case CSVReaderState::QuotedField:
                    if (c == '"') {
                        state = CSVReaderState::QuotedQuote;
                    } else {
                        fields[i].push_back(c);
                    }
                    break;
                case CSVReaderState::QuotedQuote:
                    if (c == delimiter) { // , after closing quote
                          fields.push_back(""); i++;
                          state = CSVReaderState::UnquotedField;
                    } else if (c == '"') { // "" -> "
                          fields[i].push_back('"');
                          state = CSVReaderState::QuotedField;
                    } else { // end of quote
                          state = CSVReaderState::UnquotedField;
                    }
                    break;
            }
        }
        return fields;
    }